

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O0

VkShaderStageFlagBits Diligent::ShaderTypeToVkShaderStageFlagBit(SHADER_TYPE ShaderType)

{
  bool bVar1;
  Char *pCVar2;
  undefined1 local_80 [8];
  string msg_2;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  SHADER_TYPE ShaderType_local;
  
  msg.field_2._8_4_ = ShaderType;
  bVar1 = IsPowerOfTwo<unsigned_int>(ShaderType);
  if (!bVar1) {
    FormatString<char[39]>
              ((string *)local_30,(char (*) [39])"More than one shader type is specified");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ShaderTypeToVkShaderStageFlagBit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x677);
    std::__cxx11::string::~string((string *)local_30);
  }
  if (msg.field_2._8_4_ == 1) {
    msg.field_2._12_4_ = 1;
  }
  else if (msg.field_2._8_4_ == 2) {
    msg.field_2._12_4_ = 0x10;
  }
  else if (msg.field_2._8_4_ == 4) {
    msg.field_2._12_4_ = 8;
  }
  else if (msg.field_2._8_4_ == 8) {
    msg.field_2._12_4_ = 2;
  }
  else if (msg.field_2._8_4_ == 0x10) {
    msg.field_2._12_4_ = 4;
  }
  else if (msg.field_2._8_4_ == 0x20) {
    msg.field_2._12_4_ = 0x20;
  }
  else if (msg.field_2._8_4_ == 0x40) {
    msg.field_2._12_4_ = 0x40;
  }
  else if (msg.field_2._8_4_ == 0x80) {
    msg.field_2._12_4_ = 0x80;
  }
  else if (msg.field_2._8_4_ == 0x100) {
    msg.field_2._12_4_ = 0x100;
  }
  else if (msg.field_2._8_4_ == 0x200) {
    msg.field_2._12_4_ = 0x800;
  }
  else if (msg.field_2._8_4_ == 0x400) {
    msg.field_2._12_4_ = 0x400;
  }
  else if (msg.field_2._8_4_ == 0x800) {
    msg.field_2._12_4_ = 0x200;
  }
  else if (msg.field_2._8_4_ == 0x1000) {
    msg.field_2._12_4_ = 0x1000;
  }
  else if (msg.field_2._8_4_ == 0x2000) {
    msg.field_2._12_4_ = 0x2000;
  }
  else if (msg.field_2._8_4_ == 0x4000) {
    FormatString<char[24]>
              ((string *)((long)&msg_2.field_2 + 8),(char (*) [24])"Unsupported shader type");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ShaderTypeToVkShaderStageFlagBit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x68b);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
    msg.field_2._12_4_ = 0x7fffffff;
  }
  else {
    FormatString<char[20]>((string *)local_80,(char (*) [20])"Unknown shader type");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"ShaderTypeToVkShaderStageFlagBit",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanTypeConversions.cpp"
               ,0x68e);
    std::__cxx11::string::~string((string *)local_80);
    msg.field_2._12_4_ = 0x7fffffff;
  }
  return msg.field_2._12_4_;
}

Assistant:

VkShaderStageFlagBits ShaderTypeToVkShaderStageFlagBit(SHADER_TYPE ShaderType)
{
    static_assert(SHADER_TYPE_LAST == 0x4000, "Please update the switch below to handle the new shader type");
    VERIFY(IsPowerOfTwo(Uint32{ShaderType}), "More than one shader type is specified");
    switch (ShaderType)
    {
        // clang-format off
        case SHADER_TYPE_VERTEX:           return VK_SHADER_STAGE_VERTEX_BIT;
        case SHADER_TYPE_HULL:             return VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT;
        case SHADER_TYPE_DOMAIN:           return VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT;
        case SHADER_TYPE_GEOMETRY:         return VK_SHADER_STAGE_GEOMETRY_BIT;
        case SHADER_TYPE_PIXEL:            return VK_SHADER_STAGE_FRAGMENT_BIT;
        case SHADER_TYPE_COMPUTE:          return VK_SHADER_STAGE_COMPUTE_BIT;
        case SHADER_TYPE_AMPLIFICATION:    return VK_SHADER_STAGE_TASK_BIT_EXT;
        case SHADER_TYPE_MESH:             return VK_SHADER_STAGE_MESH_BIT_EXT;
        case SHADER_TYPE_RAY_GEN:          return VK_SHADER_STAGE_RAYGEN_BIT_KHR;
        case SHADER_TYPE_RAY_MISS:         return VK_SHADER_STAGE_MISS_BIT_KHR;
        case SHADER_TYPE_RAY_CLOSEST_HIT:  return VK_SHADER_STAGE_CLOSEST_HIT_BIT_KHR;
        case SHADER_TYPE_RAY_ANY_HIT:      return VK_SHADER_STAGE_ANY_HIT_BIT_KHR;
        case SHADER_TYPE_RAY_INTERSECTION: return VK_SHADER_STAGE_INTERSECTION_BIT_KHR;
        case SHADER_TYPE_CALLABLE:         return VK_SHADER_STAGE_CALLABLE_BIT_KHR;
        // clang-format on
        case SHADER_TYPE_TILE:
            UNEXPECTED("Unsupported shader type");
            return VK_SHADER_STAGE_FLAG_BITS_MAX_ENUM;
        default:
            UNEXPECTED("Unknown shader type");
            return VK_SHADER_STAGE_FLAG_BITS_MAX_ENUM;
    }
}